

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_tree.cpp
# Opt level: O1

void __thiscall index_tree::find(index_tree *this,wstring *content,size_t cursor,int *count)

{
  pointer psVar1;
  size_t local_30;
  
  psVar1 = (this->indexes_).
           super__Vector_base<std::shared_ptr<index>,_std::allocator<std::shared_ptr<index>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->current_index_).super___shared_ptr<index,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (psVar1->super___shared_ptr<index,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_30 = cursor;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->current_index_).super___shared_ptr<index,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(psVar1->super___shared_ptr<index,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  this->active_ = true;
  do {
    index::find((this->current_index_).super___shared_ptr<index,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                content,cursor,&local_30,count);
  } while (this->active_ != false);
  return;
}

Assistant:

void index_tree::find(const std::wstring& content, std::size_t cursor, int& count)
{
    std::size_t begin_cursor = cursor;
    // 将当前索引设置为一级索引
    set_current_index(1);

    set_active(true);
    while (active_)
    {
        current_index_->find(content, begin_cursor, cursor, count);
    }
}